

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ModelIdentifier.cpp
# Opt level: O2

void __thiscall
csm::ModelIdentifier::ModelIdentifier(ModelIdentifier *this,string *argName,string *argValue)

{
  _Rb_tree_header *p_Var1;
  Data local_60;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_csm::MIC::Data>
  local_48;
  
  p_Var1 = &(this->theComponents)._M_t._M_impl.super__Rb_tree_header;
  *(undefined8 *)&(this->theComponents)._M_t._M_impl = 0;
  *(undefined8 *)&(this->theComponents)._M_t._M_impl.super__Rb_tree_header._M_header = 0;
  (this->theComponents)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->theComponents)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->theComponents)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->theComponents)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  MIC::Data::Data(&local_60,argValue);
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_csm::MIC::Data>
  ::pair<csm::MIC::Data,_true>(&local_48,argName,&local_60);
  std::
  _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,csm::MIC::Data>,std::_Select1st<std::pair<std::__cxx11::string_const,csm::MIC::Data>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,csm::MIC::Data>>>
  ::_M_insert_unique<std::pair<std::__cxx11::string_const,csm::MIC::Data>>
            ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,csm::MIC::Data>,std::_Select1st<std::pair<std::__cxx11::string_const,csm::MIC::Data>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,csm::MIC::Data>>>
              *)this,&local_48);
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_csm::MIC::Data>
  ::~pair(&local_48);
  MIC::Data::~Data(&local_60);
  return;
}

Assistant:

ModelIdentifier::ModelIdentifier(const std::string& argName,
                                  const std::string& argValue)
   :
      theComponents()
{
   theComponents.insert(MIComponent(argName,MIC::Data(argValue)));
}